

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int isDate(sqlite3_context *context,int argc,sqlite3_value **argv,DateTime *p)

{
  int iVar1;
  uchar *puVar2;
  double dVar3;
  int eType;
  uchar *z;
  int i;
  DateTime *p_local;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  memset(p,0,0x30);
  if (argc == 0) {
    context_local._4_4_ = setDateTimeToCurrent(context,p);
  }
  else {
    iVar1 = sqlite3_value_type(*argv);
    if ((iVar1 == 2) || (iVar1 == 1)) {
      dVar3 = sqlite3_value_double(*argv);
      p->iJD = (long)(dVar3 * 86400000.0 + 0.5);
      p->validJD = '\x01';
    }
    else {
      puVar2 = sqlite3_value_text(*argv);
      if ((puVar2 == (uchar *)0x0) ||
         (iVar1 = parseDateOrTime(context,(char *)puVar2,p), iVar1 != 0)) {
        return 1;
      }
    }
    for (z._4_4_ = 1; z._4_4_ < argc; z._4_4_ = z._4_4_ + 1) {
      puVar2 = sqlite3_value_text(argv[z._4_4_]);
      if ((puVar2 == (uchar *)0x0) || (iVar1 = parseModifier(context,(char *)puVar2,p), iVar1 != 0))
      {
        return 1;
      }
    }
    context_local._4_4_ = 0;
  }
  return context_local._4_4_;
}

Assistant:

static int isDate(
  sqlite3_context *context, 
  int argc, 
  sqlite3_value **argv, 
  DateTime *p
){
  int i;
  const unsigned char *z;
  int eType;
  memset(p, 0, sizeof(*p));
  if( argc==0 ){
    return setDateTimeToCurrent(context, p);
  }
  if( (eType = sqlite3_value_type(argv[0]))==SQLITE_FLOAT
                   || eType==SQLITE_INTEGER ){
    p->iJD = (sqlite3_int64)(sqlite3_value_double(argv[0])*86400000.0 + 0.5);
    p->validJD = 1;
  }else{
    z = sqlite3_value_text(argv[0]);
    if( !z || parseDateOrTime(context, (char*)z, p) ){
      return 1;
    }
  }
  for(i=1; i<argc; i++){
    z = sqlite3_value_text(argv[i]);
    if( z==0 || parseModifier(context, (char*)z, p) ) return 1;
  }
  return 0;
}